

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> * __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::populateFixedArgs
          (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
           *__return_storage_ptr__,CommandLine<Catch::ConfigData> *this,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens,
          ConfigData *config)

{
  bool bVar1;
  Token *pTVar2;
  pointer ppVar3;
  _Self local_60 [3];
  _Self local_48;
  const_iterator it;
  Token *token;
  size_t i;
  int position;
  ConfigData *config_local;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens_local;
  CommandLine<Catch::ConfigData> *this_local;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *unusedTokens;
  
  i._7_1_ = 0;
  _position = config;
  config_local = (ConfigData *)tokens;
  tokens_local = (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                  *)this;
  this_local = (CommandLine<Catch::ConfigData> *)__return_storage_ptr__;
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::vector
            (__return_storage_ptr__);
  i._0_4_ = 1;
  for (token = (Token *)0x0;
      pTVar2 = (Token *)std::
                        vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                        ::size((vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                                *)config_local), token < pTVar2;
      token = (Token *)((long)&token->type + 1)) {
    it._M_node = (_Base_ptr)
                 std::
                 vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
                 operator[]((vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                             *)config_local,(size_type)token);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::less<int>,_std::allocator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
         ::find(&this->m_positionalArgs,(key_type *)&i);
    local_60[0]._M_node =
         (_Base_ptr)
         std::
         map<int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::less<int>,_std::allocator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
         ::end(&this->m_positionalArgs);
    bVar1 = std::operator!=(&local_48,local_60);
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
               ::operator->(&local_48);
      Detail::BoundArgFunction<Catch::ConfigData>::set
                ((BoundArgFunction<Catch::ConfigData> *)&ppVar3->second,_position,
                 (string *)&(it._M_node)->_M_parent);
    }
    else {
      std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
      push_back(__return_storage_ptr__,(value_type *)it._M_node);
    }
    if ((it._M_node)->_M_color == _S_red) {
      i._0_4_ = (int)i + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Parser::Token> populateFixedArgs( std::vector<Parser::Token> const& tokens, ConfigT& config ) const {
            std::vector<Parser::Token> unusedTokens;
            int position = 1;
            for( std::size_t i = 0; i < tokens.size(); ++i ) {
                Parser::Token const& token = tokens[i];
                typename std::map<int, Arg>::const_iterator it = m_positionalArgs.find( position );
                if( it != m_positionalArgs.end() )
                    it->second.boundField.set( config, token.data );
                else
                    unusedTokens.push_back( token );
                if( token.type == Parser::Token::Positional )
                    position++;
            }
            return unusedTokens;
        }